

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

void __thiscall pbrt::Transform::Transform(Transform *this,SquareMatrix<4> *m)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int i;
  SquareMatrix<4> *pSVar8;
  long lVar9;
  int j;
  long lVar10;
  SquareMatrix<4> *this_00;
  optional<pbrt::SquareMatrix<4>_> inv;
  optional<pbrt::SquareMatrix<4>_> local_5c;
  
  uVar1 = *(undefined8 *)(m->m[0] + 2);
  uVar2 = *(undefined8 *)m->m[1];
  uVar3 = *(undefined8 *)(m->m[1] + 2);
  uVar4 = *(undefined8 *)m->m[2];
  uVar5 = *(undefined8 *)(m->m[2] + 2);
  uVar6 = *(undefined8 *)m->m[3];
  uVar7 = *(undefined8 *)(m->m[3] + 2);
  this_00 = &this->mInv;
  *(undefined8 *)(this->m).m[0] = *(undefined8 *)m->m[0];
  *(undefined8 *)((this->m).m[0] + 2) = uVar1;
  *(undefined8 *)(this->m).m[1] = uVar2;
  *(undefined8 *)((this->m).m[1] + 2) = uVar3;
  *(undefined8 *)(this->m).m[2] = uVar4;
  *(undefined8 *)((this->m).m[2] + 2) = uVar5;
  *(undefined8 *)(this->m).m[3] = uVar6;
  *(undefined8 *)((this->m).m[3] + 2) = uVar7;
  SquareMatrix<4>::SquareMatrix(this_00);
  Inverse<4>(&local_5c,m);
  if (local_5c.set == false) {
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        this_00->m[0][lVar10] = NAN;
      }
      this_00 = (SquareMatrix<4> *)(this_00->m + 1);
    }
  }
  else {
    pSVar8 = pstd::optional<pbrt::SquareMatrix<4>_>::value(&local_5c);
    uVar1 = *(undefined8 *)(pSVar8->m[0] + 2);
    uVar2 = *(undefined8 *)pSVar8->m[1];
    uVar3 = *(undefined8 *)(pSVar8->m[1] + 2);
    uVar4 = *(undefined8 *)pSVar8->m[2];
    uVar5 = *(undefined8 *)(pSVar8->m[2] + 2);
    uVar6 = *(undefined8 *)pSVar8->m[3];
    uVar7 = *(undefined8 *)(pSVar8->m[3] + 2);
    *(undefined8 *)this_00->m[0] = *(undefined8 *)pSVar8->m[0];
    *(undefined8 *)((this->mInv).m[0] + 2) = uVar1;
    *(undefined8 *)(this->mInv).m[1] = uVar2;
    *(undefined8 *)((this->mInv).m[1] + 2) = uVar3;
    *(undefined8 *)(this->mInv).m[2] = uVar4;
    *(undefined8 *)((this->mInv).m[2] + 2) = uVar5;
    *(undefined8 *)(this->mInv).m[3] = uVar6;
    *(undefined8 *)((this->mInv).m[3] + 2) = uVar7;
  }
  pstd::optional<pbrt::SquareMatrix<4>_>::~optional(&local_5c);
  return;
}

Assistant:

PBRT_CPU_GPU
    Transform(const SquareMatrix<4> &m) : m(m) {
        pstd::optional<SquareMatrix<4>> inv = Inverse(m);
        if (inv)
            mInv = *inv;
        else {
            // Initialize _mInv_ with not-a-number values
            Float NaN = std::numeric_limits<Float>::has_signaling_NaN
                            ? std::numeric_limits<Float>::signaling_NaN()
                            : std::numeric_limits<Float>::quiet_NaN();
            for (int i = 0; i < 4; ++i)
                for (int j = 0; j < 4; ++j)
                    mInv[i][j] = NaN;
        }
    }